

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_str_remove_runes(nk_str *str,int len)

{
  nk_rune local_2c;
  long lStack_28;
  nk_rune unicode;
  char *end;
  char *begin;
  int index;
  int len_local;
  nk_str *str_local;
  
  begin._4_4_ = len;
  _index = str;
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2102,"void nk_str_remove_runes(struct nk_str *, int)");
  }
  if (len < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2103,"void nk_str_remove_runes(struct nk_str *, int)");
  }
  if ((str != (nk_str *)0x0) && (-1 < len)) {
    if (len < str->len) {
      begin._0_4_ = str->len - len;
      end = nk_str_at_rune(str,(int)begin,&local_2c,(int *)((long)&begin + 4));
      lStack_28 = (long)(_index->buffer).memory.ptr + (_index->buffer).allocated;
      nk_str_remove_chars(_index,((int)lStack_28 - (int)end) + 1);
    }
    else {
      str->len = 0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_str_remove_runes(struct nk_str *str, int len)
{
    int index;
    const char *begin;
    const char *end;
    nk_rune unicode;

    NK_ASSERT(str);
    NK_ASSERT(len >= 0);
    if (!str || len < 0) return;
    if (len >= str->len) {
        str->len = 0;
        return;
    }

    index = str->len - len;
    begin = nk_str_at_rune(str, index, &unicode, &len);
    end = (const char*)str->buffer.memory.ptr + str->buffer.allocated;
    nk_str_remove_chars(str, (int)(end-begin)+1);
}